

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

int __thiscall testing::UnitTest::total_test_count(UnitTest *this)

{
  pointer ppTVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long unaff_RBX;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar9 [32];
  
  ppTVar1 = (this->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar5 = (long)(this->impl_->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1;
  if (lVar5 == 0) {
    return 0;
  }
  lVar5 = lVar5 >> 3;
  auVar10 = vpbroadcastq_avx512f();
  uVar6 = 0;
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar15 = auVar12;
    auVar12 = vpbroadcastq_avx512f();
    auVar12 = vporq_avx512f(auVar12,auVar11);
    uVar4 = vpcmpuq_avx512f(auVar12,auVar10,2);
    vmovdqu64_avx512f(*(undefined1 (*) [64])(ppTVar1 + uVar6));
    auVar12 = vpgatherqq_avx512f(*(undefined8 *)(unaff_RBX + 0x38));
    bVar3 = (byte)uVar4;
    auVar13._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar12._8_8_;
    auVar13._0_8_ = (ulong)(bVar3 & 1) * auVar12._0_8_;
    auVar13._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar12._16_8_;
    auVar13._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar12._24_8_;
    auVar13._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar12._32_8_;
    auVar13._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar12._40_8_;
    auVar13._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar12._48_8_;
    auVar13._56_8_ = (uVar4 >> 7) * auVar12._56_8_;
    auVar12 = vpgatherqq_avx512f(*(undefined8 *)(unaff_RBX + 0x30));
    auVar14._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar12._8_8_;
    auVar14._0_8_ = (ulong)(bVar3 & 1) * auVar12._0_8_;
    auVar14._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar12._16_8_;
    auVar14._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar12._24_8_;
    auVar14._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar12._32_8_;
    auVar14._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar12._40_8_;
    auVar14._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar12._48_8_;
    auVar14._56_8_ = (uVar4 >> 7) * auVar12._56_8_;
    auVar12 = vpsubq_avx512f(auVar13,auVar14);
    auVar12 = vpsrlq_avx512f(auVar12,3);
    auVar8 = vpmovqd_avx512f(auVar12);
    auVar8 = vpaddd_avx2(auVar15._0_32_,auVar8);
    uVar6 = uVar6 + 8;
    auVar12 = ZEXT3264(auVar8);
  } while ((lVar5 + (ulong)(lVar5 == 0) + 7 & 0xfffffffffffffff8) != uVar6);
  auVar8 = vmovdqa32_avx512vl(auVar8);
  auVar7._0_4_ = (uint)(bVar3 & 1) * auVar8._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar15._0_4_;
  bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
  auVar7._4_4_ = (uint)bVar2 * auVar8._4_4_ | (uint)!bVar2 * auVar15._4_4_;
  bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
  auVar7._8_4_ = (uint)bVar2 * auVar8._8_4_ | (uint)!bVar2 * auVar15._8_4_;
  bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
  auVar7._12_4_ = (uint)bVar2 * auVar8._12_4_ | (uint)!bVar2 * auVar15._12_4_;
  bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
  auVar9._16_4_ = (uint)bVar2 * auVar8._16_4_ | (uint)!bVar2 * auVar15._16_4_;
  auVar9._0_16_ = auVar7;
  bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
  auVar9._20_4_ = (uint)bVar2 * auVar8._20_4_ | (uint)!bVar2 * auVar15._20_4_;
  bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
  auVar9._24_4_ = (uint)bVar2 * auVar8._24_4_ | (uint)!bVar2 * auVar15._24_4_;
  bVar2 = SUB81(uVar4 >> 7,0);
  auVar9._28_4_ = (uint)bVar2 * auVar8._28_4_ | (uint)!bVar2 * auVar15._28_4_;
  auVar7 = vphaddd_avx(auVar9._16_16_,auVar7);
  auVar7 = vphaddd_avx(auVar7,auVar7);
  auVar7 = vphaddd_avx(auVar7,auVar7);
  return auVar7._0_4_;
}

Assistant:

const internal::UnitTestImpl* impl() const { return impl_; }